

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O1

int luaB_getfenv(lua_State *L)

{
  int iVar1;
  
  getfunc(L,1);
  iVar1 = lua_iscfunction(L,-1);
  if (iVar1 == 0) {
    lua_getfenv(L,-1);
  }
  else {
    lua_pushvalue(L,-0x2712);
  }
  return 1;
}

Assistant:

static int luaB_getfenv (lua_State *L) {
  getfunc(L, 1);
  if (lua_iscfunction(L, -1))  /* is a C function? */
    lua_pushvalue(L, LUA_GLOBALSINDEX);  /* return the thread's global env. */
  else
    lua_getfenv(L, -1);
  return 1;
}